

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O1

void Nwk_NodeUpdateArrival(Nwk_Obj_t *pObj)

{
  Tim_Man_t *p;
  Vec_Ptr_t *vQueue;
  Nwk_Obj_t *pObj_00;
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  void **ppvVar6;
  ulong uVar7;
  long lVar8;
  Nwk_Obj_t *pObj_01;
  ulong uVar9;
  long lVar10;
  float fVar11;
  
  if ((*(uint *)&pObj->field_0x20 & 7) != 3) {
    __assert_fail("Nwk_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkTiming.c"
                  ,0x23a,"void Nwk_NodeUpdateArrival(Nwk_Obj_t *)");
  }
  p = pObj->pMan->pManTime;
  vQueue = pObj->pMan->vTemp;
  fVar11 = Nwk_NodeComputeArrival(pObj,1);
  if (pObj->tRequired + 0.01 <= fVar11) {
    __assert_fail("Nwk_ManTimeLess( tArrival, Nwk_ObjRequired(pObj), (float)0.01 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkTiming.c"
                  ,0x23d,"void Nwk_NodeUpdateArrival(Nwk_Obj_t *)");
  }
  vQueue->nSize = 0;
  if (vQueue->nCap == 0) {
    if (vQueue->pArray == (void **)0x0) {
      ppvVar6 = (void **)malloc(0x80);
    }
    else {
      ppvVar6 = (void **)realloc(vQueue->pArray,0x80);
    }
    vQueue->pArray = ppvVar6;
    vQueue->nCap = 0x10;
  }
  iVar2 = vQueue->nSize;
  vQueue->nSize = iVar2 + 1;
  vQueue->pArray[iVar2] = pObj;
  pObj->field_0x20 = pObj->field_0x20 | 0x10;
  if (p != (Tim_Man_t *)0x0) {
    Tim_ManIncrementTravId(p);
  }
  if (0 < vQueue->nSize) {
    lVar10 = 0;
    pObj_01 = (Nwk_Obj_t *)0x0;
    do {
      pObj_00 = (Nwk_Obj_t *)vQueue->pArray[lVar10];
      *(uint *)&pObj_00->field_0x20 = *(uint *)&pObj_00->field_0x20 & 0xffffffef;
      fVar11 = Nwk_NodeComputeArrival(pObj_00,1);
      if ((p != (Tim_Man_t *)0x0) && ((*(uint *)&pObj_00->field_0x20 & 7) == 1)) {
        fVar11 = Tim_ManGetCiArrival(p,*(uint *)&pObj_00->field_0x20 >> 7);
      }
      if ((fVar11 + 0.01 <= pObj_00->tArrival) || (pObj_00->tArrival + 0.01 <= fVar11)) {
        pObj_00->tArrival = fVar11;
        if ((*(uint *)&pObj_00->field_0x20 & 7) == 2) {
          if ((p != (Tim_Man_t *)0x0) &&
             (iVar2 = Tim_ManBoxForCo(p,*(uint *)&pObj_00->field_0x20 >> 7), -1 < iVar2)) {
            iVar3 = Tim_ManIsCoTravIdCurrent(p,*(uint *)&pObj_00->field_0x20 >> 7);
            if (iVar3 != 0) {
              Tim_ManSetPreviousTravIdBoxInputs(p,iVar2);
            }
            Tim_ManSetCoArrival(p,*(uint *)&pObj_00->field_0x20 >> 7,fVar11);
            Tim_ManSetCurrentTravIdBoxInputs(p,iVar2);
            uVar4 = Tim_ManBoxOutputFirst(p,iVar2);
            uVar5 = Tim_ManBoxOutputNum(p,iVar2);
            if (0 < (int)uVar5) {
              uVar7 = (ulong)uVar4;
              uVar9 = (ulong)uVar5;
              do {
                if (((int)uVar4 < 0) || (pVVar1 = pObj_01->pMan->vCis, pVVar1->nSize <= (int)uVar7))
                {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                pObj_01 = (Nwk_Obj_t *)pVVar1->pArray[uVar7];
                if ((pObj_01->field_0x20 & 0x10) == 0) {
                  Nwk_NodeUpdateAddToQueue(vQueue,pObj_01,(int)lVar10,1);
                  pObj_01->field_0x20 = pObj_01->field_0x20 | 0x10;
                }
                uVar7 = uVar7 + 1;
                uVar9 = uVar9 - 1;
              } while (uVar9 != 0);
            }
          }
        }
        else if (0 < pObj_00->nFanouts) {
          lVar8 = 0;
          do {
            pObj_01 = pObj_00->pFanio[pObj_00->nFanins + lVar8];
            if (pObj_01 == (Nwk_Obj_t *)0x0) {
              pObj_01 = (Nwk_Obj_t *)0x0;
              break;
            }
            if ((pObj_01->field_0x20 & 0x10) == 0) {
              Nwk_NodeUpdateAddToQueue(vQueue,pObj_01,(int)lVar10,1);
              pObj_01->field_0x20 = pObj_01->field_0x20 | 0x10;
            }
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 < pObj_00->nFanouts);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < vQueue->nSize);
  }
  return;
}

Assistant:

void Nwk_NodeUpdateArrival( Nwk_Obj_t * pObj )
{
    Tim_Man_t * pManTime = pObj->pMan->pManTime;
    Vec_Ptr_t * vQueue = pObj->pMan->vTemp;
    Nwk_Obj_t * pTemp;
    Nwk_Obj_t * pNext = NULL; // Suppress "might be used uninitialized"
    float tArrival;
    int iCur, k, iBox, iTerm1, nTerms;
    assert( Nwk_ObjIsNode(pObj) );
    // verify the arrival time
    tArrival = Nwk_NodeComputeArrival( pObj, 1 );
    assert( Nwk_ManTimeLess( tArrival, Nwk_ObjRequired(pObj), (float)0.01 ) );
    // initialize the queue with the node
    Vec_PtrClear( vQueue );
    Vec_PtrPush( vQueue, pObj );
    pObj->MarkA = 1;
    // process objects
    if ( pManTime )
        Tim_ManIncrementTravId( pManTime );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vQueue, pTemp, iCur )
    {
        pTemp->MarkA = 0;
        tArrival = Nwk_NodeComputeArrival( pTemp, 1 );
        if ( Nwk_ObjIsCi(pTemp) && pManTime )
            tArrival = Tim_ManGetCiArrival( pManTime, pTemp->PioId );
        if ( Nwk_ManTimeEqual( tArrival, Nwk_ObjArrival(pTemp), (float)0.01 ) )
            continue;
        Nwk_ObjSetArrival( pTemp, tArrival );
        // add the fanouts to the queue
        if ( Nwk_ObjIsCo(pTemp) )
        {
            if ( pManTime )
            {
                iBox = Tim_ManBoxForCo( pManTime, pTemp->PioId );
                if ( iBox >= 0 ) // this CO is an input of the box
                {
                    // it may happen that a box-input (CO) was already marked as visited
                    // when some other box-input of the same box was visited - here we undo this
                    if ( Tim_ManIsCoTravIdCurrent( pManTime, pTemp->PioId ) )
                        Tim_ManSetPreviousTravIdBoxInputs( pManTime, iBox );
                    Tim_ManSetCoArrival( pManTime, pTemp->PioId, tArrival );
                    Tim_ManSetCurrentTravIdBoxInputs( pManTime, iBox );
                    iTerm1 = Tim_ManBoxOutputFirst( pManTime, iBox );
                    nTerms = Tim_ManBoxOutputNum( pManTime, iBox );
                    for ( k = 0; k < nTerms; k++ )
                    {
                        pNext = Nwk_ManCi(pNext->pMan, iTerm1 + k);
                        if ( pNext->MarkA )
                            continue;
                        Nwk_NodeUpdateAddToQueue( vQueue, pNext, iCur, 1 );
                        pNext->MarkA = 1;
                    }
                }
            }
        }
        else
        {
            Nwk_ObjForEachFanout( pTemp, pNext, k )
            {
                if ( pNext->MarkA )
                    continue;
                Nwk_NodeUpdateAddToQueue( vQueue, pNext, iCur, 1 );
                pNext->MarkA = 1;
            }
        }
    }
}